

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_GetGlyphShape(stbtt_fontinfo_conflict *info,int glyph_index,stbtt_vertex **pvertices)

{
  stbtt_vertex **pvertices_local;
  int glyph_index_local;
  stbtt_fontinfo_conflict *info_local;
  
  if ((info->cff).size == 0) {
    info_local._4_4_ = stbtt__GetGlyphShapeTT(info,glyph_index,pvertices);
  }
  else {
    info_local._4_4_ = stbtt__GetGlyphShapeT2(info,glyph_index,pvertices);
  }
  return info_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}